

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_week(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  bool bVar2;
  int week;
  int local_2c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit2(pig,&local_2c);
  bVar2 = local_2c - 1U < 0x35;
  if (bVar2 && bVar1) {
    *value = local_2c;
  }
  else {
    Pig::restoreTo(pig,previous);
  }
  return bVar2 && bVar1;
}

Assistant:

bool Datetime::parse_week (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int week;
  if (pig.getDigit2 (week) &&
      week > 0             &&
      week <= 53)
  {
    value = week;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}